

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O1

bool __thiscall rapic::header::get_boolean(header *this)

{
  char *__s1;
  int iVar1;
  runtime_error *this_00;
  bool bVar2;
  
  __s1 = (this->value_)._M_dataplus._M_p;
  iVar1 = strcasecmp(__s1,"true");
  bVar2 = true;
  if (iVar1 != 0) {
    iVar1 = strcasecmp(__s1,"on");
    if (iVar1 != 0) {
      iVar1 = strcasecmp(__s1,"yes");
      if (iVar1 != 0) {
        iVar1 = strcasecmp(__s1,"1");
        if (iVar1 != 0) {
          iVar1 = strcasecmp(__s1,"false");
          if (iVar1 != 0) {
            iVar1 = strcasecmp(__s1,"off");
            if (iVar1 != 0) {
              iVar1 = strcasecmp(__s1,"no");
              if (iVar1 != 0) {
                iVar1 = strcasecmp(__s1,"0");
                if (iVar1 != 0) {
                  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(this_00,"bad boolean value");
                  __cxa_throw(this_00,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
          bVar2 = false;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

scan::scan()
{
  reset();
}